

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

void __thiscall google::protobuf::io::Tokenizer::NextChar(Tokenizer *this)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  char *pcStack_20;
  
  if (this->current_char_ == '\t') {
    uVar1 = this->column_;
    uVar5 = uVar1 + 7;
    if (-1 < (int)uVar1) {
      uVar5 = uVar1;
    }
    this->column_ = (uVar5 & 0xfffffff8) + 8;
  }
  else if (this->current_char_ == '\n') {
    this->line_ = this->line_ + 1;
    this->column_ = 0;
  }
  else {
    this->column_ = this->column_ + 1;
  }
  lVar4 = (long)this->buffer_pos_ + 1;
  iVar3 = (int)lVar4;
  this->buffer_pos_ = iVar3;
  if (iVar3 < this->buffer_size_) {
    this->current_char_ = this->buffer_[lVar4];
    return;
  }
  if (this->read_error_ == true) {
    this->current_char_ = '\0';
  }
  else {
    if ((this->record_target_ != (string *)0x0) && (this->record_start_ < this->buffer_size_)) {
      std::__cxx11::string::append
                ((char *)this->record_target_,(ulong)(this->buffer_ + this->record_start_));
      this->record_start_ = 0;
    }
    pcStack_20 = (char *)0x0;
    this->buffer_ = (char *)0x0;
    this->buffer_pos_ = 0;
    do {
      iVar3 = (*this->input_->_vptr_ZeroCopyInputStream[2])
                        (this->input_,&pcStack_20,&this->buffer_size_);
      if ((char)iVar3 == '\0') {
        this->buffer_size_ = 0;
        this->read_error_ = true;
        cVar2 = '\0';
        goto LAB_002e9561;
      }
    } while (this->buffer_size_ == 0);
    this->buffer_ = pcStack_20;
    cVar2 = *pcStack_20;
LAB_002e9561:
    this->current_char_ = cVar2;
  }
  return;
}

Assistant:

void Tokenizer::NextChar() {
  // Update our line and column counters based on the character being
  // consumed.
  if (current_char_ == '\n') {
    ++line_;
    column_ = 0;
  } else if (current_char_ == '\t') {
    column_ += kTabWidth - column_ % kTabWidth;
  } else {
    ++column_;
  }

  // Advance to the next character.
  ++buffer_pos_;
  if (buffer_pos_ < buffer_size_) {
    current_char_ = buffer_[buffer_pos_];
  } else {
    Refresh();
  }
}